

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O0

Bucket __thiscall
QHashPrivate::Data<QHashPrivate::Node<QWidget*,QPointer<QPropertyAnimation>>>::
findBucketWithHash<QWidget*>
          (Data<QHashPrivate::Node<QWidget_*,_QPointer<QPropertyAnimation>_>_> *this,QWidget **key,
          size_t hash)

{
  Bucket BVar1;
  bool bVar2;
  size_t sVar3;
  Node<QWidget_*,_QPointer<QPropertyAnimation>_> *a;
  size_t in_RDX;
  QWidget **in_RSI;
  Data<QHashPrivate::Node<QWidget_*,_QPointer<QPropertyAnimation>_>_> *in_RDI;
  long in_FS_OFFSET;
  Node<QWidget_*,_QPointer<QPropertyAnimation>_> *n;
  size_t offset;
  Bucket bucket;
  Data<QHashPrivate::Node<QWidget_*,_QPointer<QPropertyAnimation>_>_> *in_stack_ffffffffffffffa8;
  Bucket *in_stack_ffffffffffffffb0;
  Bucket local_18;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_18.span = (Span *)&DAT_aaaaaaaaaaaaaaaa;
  local_18.index = (size_t)&DAT_aaaaaaaaaaaaaaaa;
  sVar3 = GrowthPolicy::bucketForHash(in_RDI->numBuckets,in_RDX);
  Data<QHashPrivate::Node<QWidget_*,_QPointer<QPropertyAnimation>_>_>::Bucket::Bucket
            (&local_18,in_RDI,sVar3);
  while (sVar3 = Data<QHashPrivate::Node<QWidget_*,_QPointer<QPropertyAnimation>_>_>::Bucket::offset
                           ((Bucket *)0x4a1001), sVar3 != 0xff) {
    a = Data<QHashPrivate::Node<QWidget_*,_QPointer<QPropertyAnimation>_>_>::Bucket::nodeAtOffset
                  (in_stack_ffffffffffffffb0,(size_t)in_stack_ffffffffffffffa8);
    bVar2 = qHashEquals<QWidget*>(&a->key,in_RSI);
    if (bVar2) break;
    Data<QHashPrivate::Node<QWidget_*,_QPointer<QPropertyAnimation>_>_>::Bucket::advanceWrapped
              (in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  BVar1.index = local_18.index;
  BVar1.span = local_18.span;
  return BVar1;
}

Assistant:

Bucket findBucketWithHash(const K &key, size_t hash) const noexcept
    {
        static_assert(std::is_same_v<std::remove_cv_t<Key>, K> ||
                QHashHeterogeneousSearch<std::remove_cv_t<Key>, K>::value);
        Q_ASSERT(numBuckets > 0);
        Bucket bucket(this, GrowthPolicy::bucketForHash(numBuckets, hash));
        // loop over the buckets until we find the entry we search for
        // or an empty slot, in which case we know the entry doesn't exist
        while (true) {
            size_t offset = bucket.offset();
            if (offset == SpanConstants::UnusedEntry) {
                return bucket;
            } else {
                Node &n = bucket.nodeAtOffset(offset);
                if (qHashEquals(n.key, key))
                    return bucket;
            }
            bucket.advanceWrapped(this);
        }
    }